

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbeSorterIterRead(sqlite3 *db,VdbeSorterIter *p,int nByte,u8 **ppOut)

{
  long lVar1;
  int iVar2;
  u8 *__dest;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  u8 *aNext;
  
  lVar1 = p->iReadOff;
  iVar6 = p->nBuffer;
  lVar4 = lVar1 % (long)iVar6;
  if (lVar4 == 0) {
    lVar3 = p->iEof - lVar1;
    if (lVar3 <= iVar6) {
      iVar6 = (int)lVar3;
    }
    iVar6 = (*p->pFile->pMethods->xRead)(p->pFile,p->aBuffer,iVar6,lVar1);
    if (iVar6 != 0) {
      return iVar6;
    }
    iVar6 = p->nBuffer;
  }
  iVar6 = iVar6 - (int)lVar4;
  iVar5 = nByte - iVar6;
  if (iVar5 == 0 || nByte < iVar6) {
    *ppOut = p->aBuffer + lVar4;
    p->iReadOff = p->iReadOff + (long)nByte;
  }
  else {
    iVar2 = p->nAlloc;
    if (iVar2 < nByte) {
      do {
        iVar2 = iVar2 * 2;
      } while (iVar2 < nByte);
      __dest = (u8 *)sqlite3DbReallocOrFree(db,p->aAlloc,iVar2);
      p->aAlloc = __dest;
      if (__dest == (u8 *)0x0) {
        return 7;
      }
      p->nAlloc = iVar2;
    }
    else {
      __dest = p->aAlloc;
    }
    memcpy(__dest,p->aBuffer + lVar4,(long)iVar6);
    p->iReadOff = p->iReadOff + (long)iVar6;
    for (; 0 < iVar5; iVar5 = iVar5 - iVar6) {
      iVar6 = p->nBuffer;
      if (iVar5 < p->nBuffer) {
        iVar6 = iVar5;
      }
      iVar2 = vdbeSorterIterRead(db,p,iVar6,&aNext);
      if (iVar2 != 0) {
        return iVar2;
      }
      memcpy(p->aAlloc + (nByte - iVar5),aNext,(long)iVar6);
    }
    *ppOut = p->aAlloc;
  }
  return 0;
}

Assistant:

static int vdbeSorterIterRead(
  sqlite3 *db,                    /* Database handle (for malloc) */
  VdbeSorterIter *p,              /* Iterator */
  int nByte,                      /* Bytes of data to read */
  u8 **ppOut                      /* OUT: Pointer to buffer containing data */
){
  int iBuf;                       /* Offset within buffer to read from */
  int nAvail;                     /* Bytes of data available in buffer */
  assert( p->aBuffer );

  /* If there is no more data to be read from the buffer, read the next 
  ** p->nBuffer bytes of data from the file into it. Or, if there are less
  ** than p->nBuffer bytes remaining in the PMA, read all remaining data.  */
  iBuf = p->iReadOff % p->nBuffer;
  if( iBuf==0 ){
    int nRead;                    /* Bytes to read from disk */
    int rc;                       /* sqlite3OsRead() return code */

    /* Determine how many bytes of data to read. */
    if( (p->iEof - p->iReadOff) > (i64)p->nBuffer ){
      nRead = p->nBuffer;
    }else{
      nRead = (int)(p->iEof - p->iReadOff);
    }
    assert( nRead>0 );

    /* Read data from the file. Return early if an error occurs. */
    rc = sqlite3OsRead(p->pFile, p->aBuffer, nRead, p->iReadOff);
    assert( rc!=SQLITE_IOERR_SHORT_READ );
    if( rc!=SQLITE_OK ) return rc;
  }
  nAvail = p->nBuffer - iBuf; 

  if( nByte<=nAvail ){
    /* The requested data is available in the in-memory buffer. In this
    ** case there is no need to make a copy of the data, just return a 
    ** pointer into the buffer to the caller.  */
    *ppOut = &p->aBuffer[iBuf];
    p->iReadOff += nByte;
  }else{
    /* The requested data is not all available in the in-memory buffer.
    ** In this case, allocate space at p->aAlloc[] to copy the requested
    ** range into. Then return a copy of pointer p->aAlloc to the caller.  */
    int nRem;                     /* Bytes remaining to copy */

    /* Extend the p->aAlloc[] allocation if required. */
    if( p->nAlloc<nByte ){
      int nNew = p->nAlloc*2;
      while( nByte>nNew ) nNew = nNew*2;
      p->aAlloc = sqlite3DbReallocOrFree(db, p->aAlloc, nNew);
      if( !p->aAlloc ) return SQLITE_NOMEM;
      p->nAlloc = nNew;
    }

    /* Copy as much data as is available in the buffer into the start of
    ** p->aAlloc[].  */
    memcpy(p->aAlloc, &p->aBuffer[iBuf], nAvail);
    p->iReadOff += nAvail;
    nRem = nByte - nAvail;

    /* The following loop copies up to p->nBuffer bytes per iteration into
    ** the p->aAlloc[] buffer.  */
    while( nRem>0 ){
      int rc;                     /* vdbeSorterIterRead() return code */
      int nCopy;                  /* Number of bytes to copy */
      u8 *aNext;                  /* Pointer to buffer to copy data from */

      nCopy = nRem;
      if( nRem>p->nBuffer ) nCopy = p->nBuffer;
      rc = vdbeSorterIterRead(db, p, nCopy, &aNext);
      if( rc!=SQLITE_OK ) return rc;
      assert( aNext!=p->aAlloc );
      memcpy(&p->aAlloc[nByte - nRem], aNext, nCopy);
      nRem -= nCopy;
    }

    *ppOut = p->aAlloc;
  }

  return SQLITE_OK;
}